

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O3

MPP_RET vdpu383_av1d_deinit(void *hal)

{
  long lVar1;
  long lVar2;
  void *ptr;
  MppBuffer buffer;
  MPP_RET MVar3;
  long lVar4;
  ulong uVar5;
  
  lVar2 = *(long *)((long)hal + 0x50);
  lVar1 = (ulong)(*(int *)((long)hal + 0x58) != 0) * 2 + 1;
  uVar5 = 0;
  do {
    ptr = *(void **)(lVar2 + 0x18 + uVar5);
    if (ptr != (void *)0x0) {
      mpp_osal_free("hal_av1d_release_res",ptr);
    }
    *(undefined8 *)(lVar2 + 0x18 + uVar5) = 0;
    uVar5 = uVar5 + 0x10;
  } while ((uint)((int)lVar1 << 4) != uVar5);
  if (*(MppBuffer *)(lVar2 + 600) != (MppBuffer)0x0) {
    MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 600),"hal_av1d_release_res");
    if (MVar3 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu383","buffer put error(%d).\n",(char *)0x0,0x547);
      }
      if ((hal_av1d_debug & 2) != 0) {
        _mpp_log_l(2,"hal_av1d_vdpu383","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",0x547);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00212c46;
      }
    }
  }
  if (*(MppBuffer *)(lVar2 + 0x40) != (MppBuffer)0x0) {
    MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 0x40),"hal_av1d_release_res");
    if (MVar3 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu383","buffer put error(%d).\n",(char *)0x0,0x548);
      }
      if ((hal_av1d_debug & 2) != 0) {
        _mpp_log_l(2,"hal_av1d_vdpu383","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",0x548);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00212c46;
      }
    }
  }
  lVar4 = 0;
  do {
    buffer = *(MppBuffer *)(lVar2 + 0xf0 + lVar4 * 8);
    if (buffer != (MppBuffer)0x0) {
      MVar3 = mpp_buffer_put_with_caller(buffer,"hal_av1d_release_res");
      if (MVar3 != MPP_OK) {
        if ((hal_av1d_debug & 1) != 0) {
          _mpp_log_l(4,"hal_av1d_vdpu383","buffer put error(%d).\n",(char *)0x0,0x54a);
        }
        if ((hal_av1d_debug & 2) != 0) {
          _mpp_log_l(2,"hal_av1d_vdpu383","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                     "hal_av1d_release_res",0x54a);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00212c46;
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar1 != lVar4);
  if (*(MppBuffer *)(lVar2 + 0x2a8) != (MppBuffer)0x0) {
    MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 0x2a8),"vdpu_av1d_filtermem_release");
    if (MVar3 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu383","buffer put error(%d).\n",(char *)0x0,0x53a);
      }
      if ((hal_av1d_debug & 2) != 0) {
        _mpp_log_l(2,"hal_av1d_vdpu383","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "vdpu_av1d_filtermem_release",0x53a);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00212c46:
          abort();
        }
      }
    }
  }
  if (*(HalBufs *)(lVar2 + 0x260) != (HalBufs)0x0) {
    hal_bufs_deinit(*(HalBufs *)(lVar2 + 0x260));
    *(undefined8 *)(lVar2 + 0x260) = 0;
  }
  if (*(HalBufs *)(lVar2 + 0x108) != (HalBufs)0x0) {
    hal_bufs_deinit(*(HalBufs *)(lVar2 + 0x108));
    *(undefined8 *)(lVar2 + 0x108) = 0;
  }
  if (*(HalBufs *)(lVar2 + 0x1ec68) != (HalBufs)0x0) {
    hal_bufs_deinit(*(HalBufs *)(lVar2 + 0x1ec68));
    *(undefined8 *)(lVar2 + 0x1ec68) = 0;
  }
  if (*(void **)((long)hal + 0x50) != (void *)0x0) {
    mpp_osal_free("hal_av1d_release_res",*(void **)((long)hal + 0x50));
  }
  *(undefined8 *)((long)hal + 0x50) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET vdpu383_av1d_deinit(void *hal)
{
    hal_av1d_release_res(hal);

    return MPP_OK;
}